

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastStFld
          (Lowerer *this,Instr *instrStFld,JnHelperMethod helperMethod,
          JnHelperMethod polymorphicHelperMethod,LabelInstr **labelBailOut,RegOpnd *typeOpnd,
          bool *pIsHelper,LabelInstr **pLabelHelper,bool withPutFlags,PropertyOperationFlags flags)

{
  uint uVar1;
  Opnd *this_00;
  Opnd *opndSrc;
  JITTimePolymorphicInlineCache *pJVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  uint16 uVar8;
  uint uVar9;
  uint uVar10;
  SymOpnd *pSVar11;
  undefined4 *puVar12;
  PropertySymOpnd *propertySymOpnd;
  PropertySym *pPVar13;
  char16 *pcVar14;
  JITTimeFunctionBody *pJVar15;
  char16 *pcVar16;
  ProfiledInstr *pPVar17;
  LabelInstr *pLVar18;
  RegOpnd *opndBase;
  RegOpnd *opndInlineCache;
  intptr_t address;
  AddrOpnd *src;
  LabelInstr *labelNext;
  BranchInstr *this_01;
  Lowerer *pLVar19;
  char16_t *pcVar20;
  char16_t *pcVar21;
  bool bVar22;
  wchar local_d8 [4];
  char16 debugStringBuffer [42];
  RegOpnd *local_60;
  RegOpnd *local_58;
  byte local_50;
  
  this_00 = instrStFld->m_dst;
  opndSrc = instrStFld->m_src1;
  bVar4 = IR::Opnd::IsSymOpnd(this_00);
  if (bVar4) {
    pSVar11 = IR::Opnd::AsSymOpnd(this_00);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar11);
    if ((!bVar4) ||
       (pSVar11 = IR::Opnd::AsSymOpnd(this_00), pSVar11->m_sym->m_kind != SymKindProperty))
    goto LAB_0056ac57;
  }
  else {
LAB_0056ac57:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x596e,
                       "(opndDst->IsSymOpnd() && opndDst->AsSymOpnd()->IsPropertySymOpnd() && opndDst->AsSymOpnd()->m_sym->IsPropertySym())"
                       ,"Expected PropertySym as dst of StFld");
    if (!bVar4) goto LAB_0056b41c;
    *puVar12 = 0;
  }
  propertySymOpnd = IR::Opnd::AsPropertySymOpnd(this_00);
  pPVar13 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
  uVar9 = Func::GetSourceContextId(this->m_func);
  uVar10 = Func::GetLocalFunctionId(this->m_func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ObjTypeSpecPhase,uVar9,uVar10);
  if (bVar4) {
    pcVar14 = Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode);
    uVar1 = pPVar13->m_propertyId;
    pJVar15 = Func::GetJITFunctionBody(this->m_func);
    pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar15);
    Output::Print(L"Field store: %s, property ID: %u, func: %s, cache ID: %d, cloned cache: false\n"
                  ,pcVar14,(ulong)uVar1,pcVar16);
    Output::Flush();
  }
  if (pIsHelper == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x597b,"(pIsHelper != nullptr)","pIsHelper != nullptr");
    if (!bVar4) goto LAB_0056b41c;
    *puVar12 = 0;
  }
  unique0x100009c7 = pPVar13;
  if (pLabelHelper == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x597e,"(pLabelHelper != nullptr)","pLabelHelper != nullptr");
    if (!bVar4) goto LAB_0056b41c;
    *puVar12 = 0;
  }
  uVar9 = Func::GetSourceContextId(this->m_func);
  uVar10 = Func::GetLocalFunctionId(this->m_func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ProfileBasedFldFastPathPhase,uVar9,uVar10);
  bVar4 = true;
  if ((bVar5) || (instrStFld->m_kind != InstrKindProfiled)) {
LAB_0056af34:
    local_50 = 0;
    bVar5 = true;
    bVar22 = true;
  }
  else {
    pPVar17 = IR::Instr::AsProfiledInstr(instrStFld);
    bVar6 = *(byte *)((long)&pPVar17->u + 2);
    if (bVar6 == 0) {
      bVar5 = ValueType::IsUninitialized((ValueType *)&(pPVar17->u).field_3);
      if (!bVar5) {
        return false;
      }
      goto LAB_0056af34;
    }
    if ((bVar6 & 5) == 0) {
      return false;
    }
    uVar9 = Func::GetSourceContextId(this->m_func);
    uVar10 = Func::GetLocalFunctionId(this->m_func);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,AddFldFastPathPhase,uVar9,uVar10);
    if (bVar5) {
      uVar9 = Func::GetSourceContextId(this->m_func);
      uVar10 = Func::GetLocalFunctionId(this->m_func);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,AddFldFastPathPhase,uVar9,uVar10);
      if (bVar5) {
        pJVar15 = Func::GetJITFunctionBody(this->m_func);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar15);
        pcVar16 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_d8);
        Output::Print(L"AddFldFastPath: function: %s(%s) property ID: %u no fast path, because the phase is off.\n"
                      ,pcVar14,pcVar16,(ulong)(uint)stack0xffffffffffffff80->m_propertyId);
        Output::Flush();
      }
      bVar6 = *(byte *)((long)&pPVar17->u + 2) & 0x60;
      bVar22 = bVar6 != 0x20;
      bVar5 = bVar6 != 0x40;
      local_50 = 0;
    }
    else {
      bVar6 = *(byte *)((long)&pPVar17->u + 2);
      bVar4 = (bVar6 & 5) != 4;
      bVar22 = (bVar6 & 0x60) != 0x20;
      bVar5 = (bVar6 & 0x60) != 0x40;
      local_50 = (bVar6 & 4) >> 2;
    }
  }
  if (*pLabelHelper == (LabelInstr *)0x0) {
    pLVar18 = IR::LabelInstr::New(Label,this->m_func,true);
    *pLabelHelper = pLVar18;
  }
  pLVar18 = IR::Instr::GetOrCreateContinueLabel(instrStFld,false);
  opndBase = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
  pJVar2 = propertySymOpnd->m_runtimePolymorphicInlineCache;
  if (local_50 != 0) {
    uVar9 = Func::GetSourceContextId(this->m_func);
    uVar10 = Func::GetLocalFunctionId(this->m_func);
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,AddFldFastPathPhase,uVar9,uVar10);
    if (bVar7) {
      pJVar15 = Func::GetJITFunctionBody(this->m_func);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar15);
      pcVar16 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_d8);
      pcVar20 = L"poly";
      if (pJVar2 == (JITTimePolymorphicInlineCache *)0x0) {
        pcVar20 = L"mono";
      }
      pcVar21 = L"add only";
      if (bVar4) {
        pcVar21 = L"store and add";
      }
      Output::Print(L"AddFldFastPath: function: %s(%s) property ID: %d %s fast path for %s.\n",
                    pcVar14,pcVar16,(ulong)(uint)stack0xffffffffffffff80->m_propertyId,pcVar20,
                    pcVar21);
      Output::Flush();
    }
  }
  opndInlineCache = IR::RegOpnd::New(TyUint64,this->m_func);
  if (pJVar2 == (JITTimePolymorphicInlineCache *)0x0) {
    src = (AddrOpnd *)LoadRuntimeInlineCacheOpnd(this,instrStFld,propertySymOpnd,*pIsHelper);
  }
  else {
    address = JITTimePolymorphicInlineCache::GetInlineCachesAddr
                        (propertySymOpnd->m_runtimePolymorphicInlineCache);
    src = IR::AddrOpnd::New(address,AddrOpndKindDynamicInlineCache,this->m_func,true,(Var)0x0);
  }
  InsertMove(&opndInlineCache->super_Opnd,&src->super_Opnd,instrStFld,true);
  local_60 = typeOpnd;
  if (typeOpnd == (RegOpnd *)0x0) {
    local_60 = IR::RegOpnd::New(TyUint64,this->m_func);
    GenerateObjectTestAndTypeLoad(this,instrStFld,opndBase,local_60,*pLabelHelper);
  }
  if (pJVar2 != (JITTimePolymorphicInlineCache *)0x0) {
    uVar8 = JITTimePolymorphicInlineCache::GetSize(propertySymOpnd->m_runtimePolymorphicInlineCache)
    ;
    LowererMD::GenerateLoadPolymorphicInlineCacheSlot
              (instrStFld,opndInlineCache,local_60,(uint)uVar8);
  }
  if (bVar4) {
    if (bVar5) {
      labelNext = IR::LabelInstr::New(Label,this->m_func,*pIsHelper);
      this_01 = GenerateLocalInlineCacheCheck(instrStFld,local_60,opndInlineCache,labelNext,false);
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,true);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
    else {
      labelNext = (LabelInstr *)0x0;
      this_01 = (BranchInstr *)0x0;
    }
    if (bVar22) {
      local_58 = IR::RegOpnd::New(TyUint64,this->m_func);
      LowererMD::GenerateLoadTaggedType(instrStFld,local_60,local_58);
      labelNext = IR::LabelInstr::New(Label,this->m_func,*pIsHelper);
      this_01 = GenerateLocalInlineCacheCheck(instrStFld,local_58,opndInlineCache,labelNext,false);
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,false);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
    else {
      local_58 = (RegOpnd *)0x0;
    }
  }
  else {
    labelNext = (LabelInstr *)0x0;
    local_58 = (RegOpnd *)0x0;
    this_01 = (BranchInstr *)0x0;
  }
  if (local_50 != 0) {
    if (bVar5) {
      labelNext = IR::LabelInstr::New(Label,this->m_func,*pIsHelper);
      pLVar19 = (Lowerer *)instrStFld;
      this_01 = GenerateLocalInlineCacheCheck(instrStFld,local_60,opndInlineCache,labelNext,true);
      GenerateSetObjectTypeFromInlineCache(pLVar19,instrStFld,opndBase,opndInlineCache,false);
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,true);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
    if (bVar22) {
      if (local_58 == (RegOpnd *)0x0) {
        local_58 = IR::RegOpnd::New(TyUint64,this->m_func);
        LowererMD::GenerateLoadTaggedType(instrStFld,local_60,local_58);
      }
      labelNext = IR::LabelInstr::New(Label,this->m_func,false);
      pLVar19 = (Lowerer *)instrStFld;
      this_01 = GenerateLocalInlineCacheCheck(instrStFld,local_58,opndInlineCache,labelNext,true);
      GenerateAuxSlotAdjustmentRequiredCheck(pLVar19,instrStFld,opndInlineCache,*pLabelHelper);
      GenerateSetObjectTypeFromInlineCache(pLVar19,instrStFld,opndBase,opndInlineCache,true);
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,false);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
  }
  if (this_01 == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a1c,"(lastBranchToNext)","lastBranchToNext");
    if (!bVar4) {
LAB_0056b41c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
  }
  IR::BranchInstr::SetTarget(this_01,*pLabelHelper);
  IR::Instr::Remove(&labelNext->super_Instr);
  *pIsHelper = true;
  return false;
}

Assistant:

bool
Lowerer::GenerateFastStFld(IR::Instr * const instrStFld, IR::JnHelperMethod helperMethod, IR::JnHelperMethod polymorphicHelperMethod, IR::LabelInstr ** labelBailOut, IR::RegOpnd* typeOpnd,
    bool* pIsHelper, IR::LabelInstr** pLabelHelper, bool withPutFlags, Js::PropertyOperationFlags flags)
{
    // Generates:
    //
    // r1 = object->type
    // if (r1 is taggedInt) goto helper
    // Load inline cache
    //    if monomorphic
    //        r2 = address of the monomorphic inline cache
    //    if polymorphic
    //        r2 = address of the polymorphic inline cache array
    //        r3 = (type >> PIC shift amount) & (PIC size - 1)
    //        r2 = r2 + r3
    // Try store property using local cache
    //
    // Loading property using local cache:
    //    if (r1 == r2->u.local.type)
    //        store value to inline slot r2->u.local.slotIndex on r1
    //        goto fallthru
    //    if ((r1 | InlineCacheAuxSlotTypeTag) == r2->u.local.type)
    //        store value to aux slot r2->u.local.slotIndex on r1
    //        goto fallthru
    //
    // Storing to an inline slot:
    //    [r1 + slotIndex * sizeof(Var)] = value
    //
    // Storing to an aux slot:
    //    slotArray = r1->auxSlots
    //    [slotArray + slotIndex * sizeof(Var)] = value
    //
    // We don't emit the type check with aux slot tag if the profile data indicates that we didn't
    // store the property to an aux slot before.
    // We don't emit the type check without an aux slot tag if the profile data indicates that we didn't
    // store the property to an inline slot before.

    IR::Opnd * opndSrc = instrStFld->GetSrc1();
    IR::Opnd * opndDst = instrStFld->GetDst();
    AssertMsg(opndDst->IsSymOpnd() && opndDst->AsSymOpnd()->IsPropertySymOpnd() && opndDst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected PropertySym as dst of StFld");

    IR::PropertySymOpnd * propertySymOpnd = opndDst->AsPropertySymOpnd();
    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %u, func: %s, cache ID: %d, cloned cache: false\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySym->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex);

    Assert(pIsHelper != nullptr);
    bool& isHelper = *pIsHelper;

    Assert(pLabelHelper != nullptr);
    IR::LabelInstr*& labelHelper = *pLabelHelper;

    bool doStore = true;
    bool doAdd = false;
    bool doInlineSlots = true;
    bool doAuxSlots = true;
    if (!PHASE_OFF(Js::ProfileBasedFldFastPathPhase, this->m_func) && instrStFld->IsProfiledInstr())
    {
        IR::ProfiledInstr * profiledInstrStFld = instrStFld->AsProfiledInstr();
        if (profiledInstrStFld->u.FldInfo().flags != Js::FldInfo_NoInfo)
        {
            if (!(profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromLocalWithoutProperty)))
            {
                return false;
            }

            if (!PHASE_OFF(Js::AddFldFastPathPhase, this->m_func))
            {
                // We always try to do the store field fast path, unless the profile specifically says we never set, but always add a property here.
                if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromLocalWithoutProperty)) == Js::FldInfo_FromLocalWithoutProperty)
                {
                    doStore = false;
                }

                // On the other hand, we only emit the add field fast path, if the profile explicitly says we do add properties here.
                if (!!(profiledInstrStFld->u.FldInfo().flags & Js::FldInfo_FromLocalWithoutProperty))
                {
                    doAdd = true;
                }
            }
            else
            {
                #if ENABLE_DEBUG_CONFIG_OPTIONS
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                #endif
                PHASE_PRINT_TRACE(Js::AddFldFastPathPhase, this->m_func,
                    _u("AddFldFastPath: function: %s(%s) property ID: %u no fast path, because the phase is off.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    propertySym->m_propertyId);
            }

            if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromInlineSlots | Js::FldInfo_FromAuxSlots)) == Js::FldInfo_FromInlineSlots)
            {
                // If the inline slots flag is set and the aux slots flag is not, only generate the inline slots check
                doAuxSlots = false;
            }
            else if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromInlineSlots | Js::FldInfo_FromAuxSlots)) == Js::FldInfo_FromAuxSlots)
            {
                // If the aux slots flag is set and the inline slots flag is not, only generate the aux slots check
                doInlineSlots = false;
            }
        }
        else if (!profiledInstrStFld->u.FldInfo().valueType.IsUninitialized())
        {
            // We have value type info about the field but no flags. This means we shouldn't generate any
            // fast paths for this field store.
            return false;
        }
    }

    Assert(doStore || doAdd);

    if (labelHelper == nullptr)
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    }

    IR::LabelInstr * labelFallThru = instrStFld->GetOrCreateContinueLabel();
    IR::RegOpnd * opndBase = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
    bool usePolymorphicInlineCache = !!propertySymOpnd->m_runtimePolymorphicInlineCache;

    if (doAdd)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        PHASE_PRINT_TRACE(Js::AddFldFastPathPhase, this->m_func,
            _u("AddFldFastPath: function: %s(%s) property ID: %d %s fast path for %s.\n"),
            this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
            propertySym->m_propertyId,
            usePolymorphicInlineCache ? _u("poly") : _u("mono"), doStore ? _u("store and add") : _u("add only"));
    }

    IR::RegOpnd * opndInlineCache = IR::RegOpnd::New(TyMachPtr, this->m_func);
    if (usePolymorphicInlineCache)
    {
        Lowerer::InsertMove(opndInlineCache, IR::AddrOpnd::New(propertySymOpnd->m_runtimePolymorphicInlineCache->GetInlineCachesAddr(), IR::AddrOpndKindDynamicInlineCache, this->m_func, true), instrStFld);
    }
    else
    {
        Lowerer::InsertMove(opndInlineCache, this->LoadRuntimeInlineCacheOpnd(instrStFld, propertySymOpnd, isHelper), instrStFld);
    }

    if (typeOpnd == nullptr)
    {
        typeOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
        GenerateObjectTestAndTypeLoad(instrStFld, opndBase, typeOpnd, labelHelper);
    }

    if (usePolymorphicInlineCache)
    {
        LowererMD::GenerateLoadPolymorphicInlineCacheSlot(instrStFld, opndInlineCache, typeOpnd, propertySymOpnd->m_runtimePolymorphicInlineCache->GetSize());
    }

    IR::LabelInstr * labelNext = nullptr;
    IR::RegOpnd * opndTaggedType = nullptr;
    IR::BranchInstr * lastBranchToNext = nullptr;

    if (doStore)
    {
        if (doInlineSlots)
        {
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, typeOpnd, opndInlineCache, labelNext);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, true);
            instrStFld->InsertBefore(labelNext);
        }
        if (doAuxSlots)
        {
            if (opndTaggedType == nullptr)
            {
                opndTaggedType = IR::RegOpnd::New(TyMachPtr, this->m_func);
                LowererMD::GenerateLoadTaggedType(instrStFld, typeOpnd, opndTaggedType);
            }
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, opndTaggedType, opndInlineCache, labelNext);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, false);
            instrStFld->InsertBefore(labelNext);
        }
    }

    if (doAdd)
    {
        if (doInlineSlots)
        {
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, typeOpnd, opndInlineCache, labelNext, true);
            GenerateSetObjectTypeFromInlineCache(instrStFld, opndBase, opndInlineCache, false);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, true);
            instrStFld->InsertBefore(labelNext);
        }
        if (doAuxSlots)
        {
            if (opndTaggedType == nullptr)
            {
                opndTaggedType = IR::RegOpnd::New(TyMachPtr, this->m_func);
                LowererMD::GenerateLoadTaggedType(instrStFld, typeOpnd, opndTaggedType);
            }
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, opndTaggedType, opndInlineCache, labelNext, true);
            GenerateAuxSlotAdjustmentRequiredCheck(instrStFld, opndInlineCache, labelHelper);
            GenerateSetObjectTypeFromInlineCache(instrStFld, opndBase, opndInlineCache, true);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, false);
            instrStFld->InsertBefore(labelNext);
        }
    }

    Assert(lastBranchToNext);
    lastBranchToNext->SetTarget(labelHelper);
    labelNext->Remove();

    // $helper:
    //     CALL Helper(inlineCache, base, field, src, scriptContext)
    // $fallthru:
    isHelper = true;

    // Return false to indicate the original instruction was not lowered.  Caller will insert the helper label.
    return false;
}